

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLayerNormalizationWrongGammaOrBeta(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  WeightParams *pWVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar10;
  QuantizationParams *pQVar11;
  ostream *poVar12;
  string *psVar13;
  long lVar14;
  Rep *pRVar15;
  int iVar16;
  int iVar17;
  Result res1;
  Model m;
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Model local_c8;
  Result local_98;
  Result local_70;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_c8);
  if (local_c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_c8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_f0 + 0x10;
  local_f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar17 = (pAVar9->shape_).current_size_;
  iVar16 = (pAVar9->shape_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 1);
    iVar17 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
  }
  pRVar15 = (pAVar9->shape_).rep_;
  iVar5 = iVar17 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar15->elements[iVar17] = 3;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  iVar17 = iVar5 + 1;
  pRVar1->current_size_ = iVar17;
  pRVar15->elements[iVar5] = 5;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar17 = (pAVar9->shape_).current_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar17 + 1;
  pRVar15->elements[iVar17] = 2;
  if (local_c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_c8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar17 = (pAVar9->shape_).current_size_;
  iVar16 = (pAVar9->shape_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 1);
    iVar17 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
  }
  pRVar15 = (pAVar9->shape_).rep_;
  iVar5 = iVar17 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar15->elements[iVar17] = 3;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar17 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  iVar17 = iVar5 + 1;
  pRVar1->current_size_ = iVar17;
  pRVar15->elements[iVar5] = 5;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar17 = (pAVar9->shape_).current_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar17 + 1;
  pRVar15->elements[iVar17] = 2;
  if (local_c8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_c8);
    local_c8._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_c8.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_c8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_c8.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 0x546) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x546;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
    CoreML::Specification::LayerNormalizationLayerParams::LayerNormalizationLayerParams
              (this_01.layernormalization_);
    (this_00->layer_).layernormalization_ = (LayerNormalizationLayerParams *)this_01;
  }
  iVar17 = ((this_01.convolution_)->kernelsize_).current_size_;
  if (iVar17 == ((this_01.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&(this_01.reshape_)->targetshape_,iVar17 + 1);
    iVar17 = ((this_01.reshape_)->targetshape_).current_size_;
  }
  pWVar10 = (this_01.innerproduct_)->bias_;
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar17 + 1;
  (&pWVar10->_internal_metadata_)[iVar17].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  pWVar10 = (this_01.batchnorm_)->variance_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    (this_01.batchnorm_)->variance_ = pWVar10;
  }
  iVar17 = (pWVar10->floatvalue_).current_size_;
  if (iVar17 == (pWVar10->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
    iVar17 = (pWVar10->floatvalue_).current_size_;
  }
  (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
  ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
  pWVar10 = (this_01.gru_)->resetgateweightmatrix_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
  }
  iVar17 = (pWVar10->floatvalue_).current_size_;
  if (iVar17 == (pWVar10->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
    iVar17 = (pWVar10->floatvalue_).current_size_;
  }
  (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
  ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
  pWVar10 = (this_01.batchnorm_)->variance_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    (this_01.batchnorm_)->variance_ = pWVar10;
  }
  if (pWVar10->quantization_ == (QuantizationParams *)0x0) {
    pQVar11 = (QuantizationParams *)operator_new(0x28);
    CoreML::Specification::QuantizationParams::QuantizationParams(pQVar11);
    pWVar10->quantization_ = pQVar11;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_f0,&local_c8);
  bVar4 = CoreML::Result::good((Result *)local_f0);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x170c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  }
  else {
    psVar13 = CoreML::Result::message_abi_cxx11_((Result *)local_f0);
    lVar14 = std::__cxx11::string::find((char *)psVar13,0x2f2c97,0);
    if (lVar14 != -1) {
      pWVar10 = (this_01.batchnorm_)->variance_;
      if (pWVar10 == (WeightParams *)0x0) {
        pWVar10 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar10);
        (this_01.batchnorm_)->variance_ = pWVar10;
      }
      (pWVar10->floatvalue_).current_size_ = 0;
      iVar17 = 0;
      if ((pWVar10->floatvalue_).total_size_ == 0) {
        google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,1);
        iVar17 = (pWVar10->floatvalue_).current_size_;
      }
      (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
      ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
      pWVar10 = (this_01.gru_)->resetgateweightmatrix_;
      if (pWVar10 == (WeightParams *)0x0) {
        pWVar10 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar10);
        (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
      }
      iVar17 = (pWVar10->floatvalue_).current_size_;
      if (iVar17 == (pWVar10->floatvalue_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
        iVar17 = (pWVar10->floatvalue_).current_size_;
        pWVar3 = (this_01.gru_)->resetgateweightmatrix_;
        (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
        ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
        pWVar10 = pWVar3;
        if (pWVar3 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar10);
          (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
        }
      }
      else {
        (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
        ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
      }
      if (pWVar10->quantization_ == (QuantizationParams *)0x0) {
        pQVar11 = (QuantizationParams *)operator_new(0x28);
        CoreML::Specification::QuantizationParams::QuantizationParams(pQVar11);
        pWVar10->quantization_ = pQVar11;
      }
      CoreML::validate<(MLModelType)500>(&local_48,&local_c8);
      bVar4 = CoreML::Result::good(&local_48);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1715);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
LAB_0018c22a:
        std::ostream::put((char)poVar12);
        iVar17 = 1;
        std::ostream::flush();
      }
      else {
        psVar13 = CoreML::Result::message_abi_cxx11_(&local_48);
        lVar14 = std::__cxx11::string::find((char *)psVar13,0x2f2c97,0);
        if (lVar14 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1716);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"res2.message().find(\"quantized\") != std::string::npos",0x35);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          goto LAB_0018c22a;
        }
        pWVar10 = (this_01.batchnorm_)->variance_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar10);
          (this_01.batchnorm_)->variance_ = pWVar10;
        }
        if (pWVar10->quantization_ != (QuantizationParams *)0x0) {
          (*(pWVar10->quantization_->super_MessageLite)._vptr_MessageLite[1])();
        }
        pWVar10->quantization_ = (QuantizationParams *)0x0;
        pWVar10 = (this_01.gru_)->resetgateweightmatrix_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar10);
          (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
        }
        if (pWVar10->quantization_ != (QuantizationParams *)0x0) {
          (*(pWVar10->quantization_->super_MessageLite)._vptr_MessageLite[1])();
        }
        pWVar10->quantization_ = (QuantizationParams *)0x0;
        pWVar10 = (this_01.batchnorm_)->variance_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar10);
          (this_01.batchnorm_)->variance_ = pWVar10;
        }
        iVar17 = (pWVar10->floatvalue_).current_size_;
        if (iVar17 == (pWVar10->floatvalue_).total_size_) {
          google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
          iVar17 = (pWVar10->floatvalue_).current_size_;
        }
        (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
        ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
        CoreML::validate<(MLModelType)500>(&local_70,&local_c8);
        bVar4 = CoreML::Result::good(&local_70);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x171f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          iVar17 = 1;
          std::ostream::flush();
        }
        else {
          psVar13 = CoreML::Result::message_abi_cxx11_(&local_70);
          lVar14 = std::__cxx11::string::find((char *)psVar13,0x2f2d0d,0);
          if (lVar14 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1720);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"res3.message().find(\"Shape of gamma\") != std::string::npos",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12," was false, expected true.",0x1a);
            iVar17 = 1;
            std::endl<char,std::char_traits<char>>(poVar12);
          }
          else {
            pWVar10 = (this_01.batchnorm_)->variance_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar10);
              (this_01.batchnorm_)->variance_ = pWVar10;
            }
            (pWVar10->floatvalue_).current_size_ = 0;
            iVar17 = 0;
            if ((pWVar10->floatvalue_).total_size_ == 0) {
              google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,1);
              iVar17 = (pWVar10->floatvalue_).current_size_;
            }
            (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
            ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
            pWVar10 = (this_01.gru_)->resetgateweightmatrix_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar10);
              (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
            }
            iVar17 = (pWVar10->floatvalue_).current_size_;
            if (iVar17 == (pWVar10->floatvalue_).total_size_) {
              google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
              iVar17 = (pWVar10->floatvalue_).current_size_;
              pWVar3 = (this_01.gru_)->resetgateweightmatrix_;
              (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
              ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
              pWVar10 = pWVar3;
              if (pWVar3 == (WeightParams *)0x0) {
                pWVar10 = (WeightParams *)operator_new(0x50);
                CoreML::Specification::WeightParams::WeightParams(pWVar10);
                (this_01.gru_)->resetgateweightmatrix_ = pWVar10;
              }
            }
            else {
              (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
              ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
            }
            iVar17 = (pWVar10->floatvalue_).current_size_;
            if (iVar17 == (pWVar10->floatvalue_).total_size_) {
              google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar17 + 1);
              iVar17 = (pWVar10->floatvalue_).current_size_;
            }
            (pWVar10->floatvalue_).current_size_ = iVar17 + 1;
            ((pWVar10->floatvalue_).rep_)->elements[iVar17] = 1.0;
            CoreML::validate<(MLModelType)500>(&local_98,&local_c8);
            bVar4 = CoreML::Result::good(&local_98);
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1728);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," was false, expected true.",0x1a);
LAB_0018c577:
              iVar17 = 1;
              std::endl<char,std::char_traits<char>>(poVar12);
            }
            else {
              psVar13 = CoreML::Result::message_abi_cxx11_(&local_98);
              iVar17 = 0;
              lVar14 = std::__cxx11::string::find((char *)psVar13,0x2f2d57,0);
              if (lVar14 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1729);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"res4.message().find(\"Shape of beta\") != std::string::npos",
                           0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," was false, expected true.",0x1a);
                goto LAB_0018c577;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.m_message._M_dataplus._M_p != &local_98.m_message.field_2) {
              operator_delete(local_98.m_message._M_dataplus._M_p,
                              local_98.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
          operator_delete(local_70.m_message._M_dataplus._M_p,
                          local_70.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
        operator_delete(local_48.m_message._M_dataplus._M_p,
                        local_48.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0018c5e1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x170d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"res1.message().find(\"quantized\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  }
  std::ostream::put((char)poVar12);
  iVar17 = 1;
  std::ostream::flush();
LAB_0018c5e1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &local_d8) {
    operator_delete((void *)local_f0._8_8_,local_d8._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_c8);
  return iVar17;
}

Assistant:

int testInvalidLayerNormalizationWrongGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_gamma()->mutable_quantization();

    // value of gamma and beta should be unquantized
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("quantized") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->mutable_quantization();

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("quantized") != std::string::npos);

    // shape of gamma and beta should be match normalized shape

    params->mutable_gamma()->clear_quantization();
    params->mutable_beta()->clear_quantization();
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Shape of gamma") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Shape of beta") != std::string::npos);

    return 0;
}